

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O3

void __thiscall BMRS_XZ<UFPC>::PerformLabeling(BMRS_XZ<UFPC> *this)

{
  Data_Compressed *data_compressed;
  size_t __n;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  Mat1b *pMVar4;
  int *piVar5;
  Mat1i *pMVar6;
  long lVar7;
  uint *puVar8;
  Run *pRVar9;
  uint64_t *puVar10;
  long lVar11;
  uint64_t *puVar12;
  uint64_t *puVar13;
  Run *pRVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  Run *pRVar21;
  ulong uVar22;
  uint64_t *puVar23;
  uint64_t *puVar24;
  long lVar25;
  ulong uVar26;
  uint64_t *puVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar33;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long local_120;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar33 = *(int *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  data_compressed = &this->data_compressed;
  (this->data_compressed).height = iVar33;
  (this->data_compressed).width = uVar3;
  uVar30 = uVar3 + 0x3f;
  if (-1 < (int)uVar3) {
    uVar30 = uVar3;
  }
  iVar29 = (int)uVar30 >> 6;
  iVar36 = iVar29 + 1;
  (this->data_compressed).data_width = iVar36;
  uVar22 = (ulong)(uint)(iVar36 * iVar33) * 8;
  if (iVar36 * iVar33 < 0) {
    uVar22 = 0xffffffffffffffff;
  }
  puVar10 = (uint64_t *)operator_new__(uVar22);
  (this->data_compressed).bits = puVar10;
  InitCompressedData(this,data_compressed);
  uVar18 = iVar33 / 2;
  iVar16 = iVar33 % 2;
  uVar17 = iVar16 + uVar18;
  uVar30 = (this->data_compressed).data_width;
  lVar11 = (long)(int)uVar30;
  (this->data_merged).height = uVar17;
  (this->data_merged).width = uVar3;
  (this->data_merged).data_width = iVar36;
  uVar22 = (ulong)(uVar17 * iVar36) * 8;
  if ((int)(uVar17 * iVar36) < 0) {
    uVar22 = 0xffffffffffffffff;
  }
  puVar10 = (uint64_t *)operator_new__(uVar22);
  (this->data_merged).bits = puVar10;
  if (1 < iVar33) {
    puVar12 = data_compressed->bits;
    puVar13 = puVar12 + lVar11;
    uVar22 = 0;
    puVar24 = puVar10;
    do {
      if (0 < (int)uVar30) {
        uVar26 = 0;
        do {
          puVar24[uVar26] = puVar13[uVar26] | puVar12[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar30 != uVar26);
      }
      uVar22 = uVar22 + 1;
      puVar24 = puVar24 + (long)iVar29 + 1;
      puVar13 = puVar13 + lVar11 * 2;
      puVar12 = puVar12 + lVar11 * 2;
    } while (uVar22 != uVar18);
  }
  if ((iVar16 != 0) && (0 < (int)uVar30)) {
    puVar13 = data_compressed->bits;
    uVar22 = 0;
    do {
      puVar10[(long)(int)uVar18 * (long)iVar36 + uVar22] = puVar13[(iVar33 + -1) * lVar11 + uVar22];
      uVar22 = uVar22 + 1;
    } while (uVar30 != uVar22);
  }
  uVar28 = uVar17 - 1;
  (this->data_flags).height = uVar28;
  (this->data_flags).width = uVar3;
  (this->data_flags).data_width = iVar36;
  uVar22 = 0xffffffffffffffff;
  if (-1 < (int)(iVar36 * uVar28)) {
    uVar22 = (ulong)(iVar36 * uVar28) * 8;
  }
  puVar13 = (uint64_t *)operator_new__(uVar22);
  (this->data_flags).bits = puVar13;
  if (1 < (int)uVar17) {
    puVar24 = data_compressed->bits;
    puVar12 = puVar24 + lVar11;
    uVar22 = 0;
    puVar27 = puVar13;
    puVar23 = puVar24;
    do {
      puVar23 = puVar23 + lVar11 * 2;
      puVar13[uVar22 * (long)iVar36] =
           (puVar24[(uVar22 * 2 + 2) * lVar11] * 2 | puVar24[(uVar22 * 2 + 2) * lVar11]) &
           (puVar24[(uVar22 * 2 + 1) * lVar11] * 2 | puVar24[(uVar22 * 2 + 1) * lVar11]);
      if (1 < (int)uVar30) {
        uVar26 = 1;
        do {
          puVar27[uVar26] =
               (puVar23[uVar26 - 1] >> 0x3f | puVar23[uVar26] << 1 | puVar23[uVar26]) &
               (puVar12[uVar26 - 1] >> 0x3f | puVar12[uVar26] << 1 | puVar12[uVar26]);
          uVar26 = uVar26 + 1;
        } while (uVar30 != uVar26);
      }
      uVar22 = uVar22 + 1;
      puVar27 = puVar27 + (long)iVar29 + 1;
      puVar12 = puVar12 + lVar11 * 2;
    } while (uVar22 != uVar28);
  }
  (this->data_runs).height = uVar17;
  (this->data_runs).width = uVar3;
  pRVar14 = (Run *)operator_new__((ulong)(((uVar3 >> 1) + 2) * uVar17 + 1) << 3);
  (this->data_runs).runs = pRVar14;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar36 = *(int *)&pMVar4->field_0x8;
  iVar29 = *(int *)&pMVar4->field_0xc;
  UFPC::P_ = (uint *)operator_new__((ulong)(((iVar29 - (iVar29 + 1 >> 0x1f)) + 1 >> 1) *
                                            ((iVar36 - (iVar36 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  FindRuns(this,puVar10,puVar13,uVar17,uVar30,pRVar14);
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar5,piVar5[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pRVar14 = (this->data_runs).runs;
  pRVar21 = pRVar14;
  if (1 < iVar33) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar10 = (this->data_compressed).bits;
    lVar11 = *(long *)&pMVar6->field_0x10;
    lVar7 = **(long **)&pMVar6->field_0x48;
    lVar19 = lVar7 * 2;
    lVar25 = 0;
    uVar22 = 0;
    local_120 = lVar11;
    do {
      puVar8 = UFPC::P_;
      iVar36 = (this->data_compressed).data_width;
      iVar29 = (int)uVar22 * iVar36;
      uVar26 = 0;
      pRVar9 = pRVar21;
      do {
        pRVar21 = pRVar9;
        uVar30 = (uint)uVar26;
        if (pRVar21->start_pos == 0xffff) {
          if ((int)uVar30 < (int)uVar3) {
            __n = (ulong)((uVar3 - 1) - uVar30) * 4 + 4;
            memset((void *)(lVar19 * uVar22 + lVar11 + uVar26 * 4),0,__n);
            memset((void *)(lVar11 + lVar7 + lVar19 * uVar22 + uVar26 * 4),0,__n);
          }
          pRVar21 = pRVar21 + 1;
          break;
        }
        uVar1 = pRVar21->end_pos;
        uVar17 = puVar8[pRVar21->label];
        uVar28 = (uint)pRVar21->start_pos;
        if (uVar30 < uVar28) {
          lVar15 = local_120 + uVar26 * 4;
          lVar20 = 0;
          do {
            *(undefined4 *)(lVar15 + lVar20 * 4) = 0;
            *(undefined4 *)(lVar7 + lVar15 + lVar20 * 4) = 0;
            lVar20 = lVar20 + 1;
          } while (uVar28 - uVar26 != lVar20);
          uVar26 = (ulong)uVar28;
        }
        if ((uint)uVar26 < (uint)uVar1) {
          do {
            lVar15 = (long)((int)(uint)uVar26 >> 6);
            uVar31 = (uint)uVar26 & 0x3f;
            uVar30 = uVar17;
            if ((puVar10[iVar29 * 2 + lVar15] >> uVar31 & 1) == 0) {
              uVar30 = 0;
            }
            *(uint *)(lVar11 + lVar25 + uVar26 * 4) = uVar30;
            uVar30 = uVar17;
            if ((puVar10[(long)(iVar29 * 2) + iVar36 + lVar15] >> uVar31 & 1) == 0) {
              uVar30 = 0;
            }
            *(uint *)(lVar11 + lVar7 + lVar25 + uVar26 * 4) = uVar30;
            uVar26 = uVar26 + 1;
          } while (uVar1 != uVar26);
          uVar26 = (ulong)uVar1;
        }
        pRVar9 = pRVar21 + 1;
      } while (uVar28 != 0xffff);
      uVar22 = uVar22 + 1;
      local_120 = local_120 + lVar19;
      lVar25 = lVar25 + lVar19;
    } while (uVar22 != uVar18);
  }
  puVar8 = UFPC::P_;
  if (iVar16 != 0) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar19 = (long)(iVar33 + -1) * **(long **)&pMVar6->field_0x48;
    lVar7 = *(long *)&pMVar6->field_0x10;
    lVar11 = lVar7 + lVar19;
    uVar30 = 0;
    auVar37 = _DAT_00328420;
    auVar38 = _DAT_00328430;
    auVar39 = _DAT_00328440;
    do {
      uVar1 = pRVar21->start_pos;
      if (uVar1 == 0xffff) {
        if ((int)uVar30 < (int)uVar3) {
          memset((void *)(lVar11 + (ulong)uVar30 * 4),0,(ulong)(uVar3 + ~uVar30) * 4 + 4);
        }
        break;
      }
      uVar2 = pRVar21->end_pos;
      uVar17 = puVar8[pRVar21->label];
      uVar18 = (uint)uVar1;
      if (uVar30 < uVar18) {
        memset((void *)(lVar11 + (ulong)uVar30 * 4),0,(ulong)(~uVar30 + uVar18) * 4 + 4);
        auVar37 = _DAT_00328420;
        auVar38 = _DAT_00328430;
        auVar39 = _DAT_00328440;
      }
      uVar30 = uVar18;
      if (uVar1 < uVar2) {
        uVar30 = (uint)uVar2;
        lVar15 = (ulong)uVar2 - (ulong)uVar18;
        lVar25 = lVar15 + -1;
        auVar32._8_4_ = (int)lVar25;
        auVar32._0_8_ = lVar25;
        auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
        lVar25 = lVar7 + lVar19 + 0xc + (ulong)uVar18 * 4;
        auVar32 = auVar32 ^ auVar39;
        uVar22 = 0;
        do {
          auVar34._8_4_ = (int)uVar22;
          auVar34._0_8_ = uVar22;
          auVar34._12_4_ = (int)(uVar22 >> 0x20);
          auVar35 = (auVar34 | auVar38) ^ auVar39;
          iVar33 = auVar32._4_4_;
          if ((bool)(~(iVar33 < auVar35._4_4_ ||
                      auVar32._0_4_ < auVar35._0_4_ && auVar35._4_4_ == iVar33) & 1)) {
            *(uint *)(lVar25 + -0xc + uVar22 * 4) = uVar17;
          }
          if (auVar35._12_4_ <= auVar32._12_4_ &&
              (auVar35._8_4_ <= auVar32._8_4_ || auVar35._12_4_ != auVar32._12_4_)) {
            *(uint *)(lVar25 + -8 + uVar22 * 4) = uVar17;
          }
          auVar34 = (auVar34 | auVar37) ^ auVar39;
          iVar36 = auVar34._4_4_;
          if (iVar36 <= iVar33 && (iVar36 != iVar33 || auVar34._0_4_ <= auVar32._0_4_)) {
            *(uint *)(lVar25 + -4 + uVar22 * 4) = uVar17;
            *(uint *)(lVar25 + uVar22 * 4) = uVar17;
          }
          uVar22 = uVar22 + 4;
        } while ((lVar15 + 3U & 0xfffffffffffffffc) != uVar22);
      }
      pRVar21 = pRVar21 + 1;
    } while (uVar1 != 0xffff);
  }
  if (UFPC::P_ != (uint *)0x0) {
    operator_delete__(UFPC::P_);
    pRVar14 = (this->data_runs).runs;
  }
  if (pRVar14 != (Run *)0x0) {
    operator_delete__(pRVar14);
  }
  puVar10 = (this->data_flags).bits;
  if (puVar10 != (uint64_t *)0x0) {
    operator_delete__(puVar10);
  }
  puVar10 = (this->data_merged).bits;
  if (puVar10 != (uint64_t *)0x0) {
    operator_delete__(puVar10);
  }
  if (data_compressed->bits != (uint64_t *)0x0) {
    operator_delete__(data_compressed->bits);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
		int w(img_.cols);
		int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h_merge, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        img_labels_ = cv::Mat1i(img_.size());

        // New version (uses 1-byte per pixel input)
        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }